

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decompressStream(ZSTD_DStream *zds,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  bool bVar1;
  char *dst_00;
  char *src_00;
  ZSTD_outBuffer *pZVar2;
  uint uVar3;
  U32 UVar4;
  int iVar5;
  ZSTD_nextInputType_e ZVar6;
  ZSTD_DStream *code;
  ulong __n;
  ZSTD_DDict *pZVar7;
  void *pvVar8;
  ulong uVar9;
  size_t sVar10;
  size_t sVar11;
  bool bVar12;
  ulong local_1a8;
  void *local_198;
  uint local_18c;
  size_t local_188;
  void *local_150;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  size_t nextSrcSizeHint;
  size_t flushedSize;
  size_t toFlushSize;
  size_t err_code_4;
  size_t loadedSize;
  int isSkipFrame;
  size_t toLoad_1;
  size_t neededInSize_1;
  size_t err_code_3;
  size_t neededInSize;
  size_t bufferSize;
  int tooLarge;
  int tooSmall;
  size_t neededOutBuffSize;
  size_t neededInBuffSize;
  size_t err_code_2;
  size_t err_code_1;
  size_t decompressedSize;
  size_t cSize;
  size_t remainingInput;
  size_t toLoad;
  size_t hSize;
  size_t err_code;
  char *pcStack_68;
  U32 someMoreWork;
  char *op;
  char *oend;
  char *ostart;
  char *dst;
  char *ip;
  char *iend;
  char *istart;
  char *src;
  ZSTD_inBuffer *input_local;
  ZSTD_outBuffer *output_local;
  ZSTD_DStream *zds_local;
  
  istart = (char *)input->src;
  local_128 = istart;
  if (input->pos != 0) {
    local_128 = istart + input->pos;
  }
  iend = local_128;
  local_130 = istart;
  if (input->size != 0) {
    local_130 = istart + input->size;
  }
  ip = local_130;
  dst = local_128;
  ostart = (char *)output->dst;
  local_138 = ostart;
  if (output->pos != 0) {
    local_138 = ostart + output->pos;
  }
  oend = local_138;
  local_140 = ostart;
  if (output->size != 0) {
    local_140 = ostart + output->size;
  }
  op = local_140;
  pcStack_68 = local_138;
  bVar1 = true;
  if (input->size < input->pos) {
    zds_local = (ZSTD_DStream *)0xffffffffffffffb8;
  }
  else if (output->size < output->pos) {
    zds_local = (ZSTD_DStream *)0xffffffffffffffba;
  }
  else {
    src = (char *)input;
    input_local = (ZSTD_inBuffer *)output;
    output_local = (ZSTD_outBuffer *)zds;
    code = (ZSTD_DStream *)ZSTD_checkOutBuffer(zds,output);
    uVar3 = ERR_isError((size_t)code);
    zds_local = code;
    if (uVar3 == 0) {
      do {
        if (!bVar1) {
          *(long *)(src + 0x10) = (long)dst - *(long *)src;
          input_local->pos = (long)pcStack_68 - (long)input_local->src;
          output_local[0x4ef].pos = (size_t)input_local->src;
          output_local[0x4f0].dst = (void *)input_local->size;
          output_local[0x4f0].size = input_local->pos;
          if ((dst == iend) && (pcStack_68 == oend)) {
            *(int *)((long)&output_local[0x4ef].dst + 4) =
                 *(int *)((long)&output_local[0x4ef].dst + 4) + 1;
            if (0xf < *(int *)((long)&output_local[0x4ef].dst + 4)) {
              if (pcStack_68 == op) {
                return 0xffffffffffffffba;
              }
              if (dst == ip) {
                return 0xffffffffffffffb8;
              }
            }
          }
          else {
            *(undefined4 *)((long)&output_local[0x4ef].dst + 4) = 0;
          }
          sVar11 = ZSTD_nextSrcSizeToDecompress((ZSTD_DCtx *)output_local);
          if (sVar11 != 0) {
            ZVar6 = ZSTD_nextInputType((ZSTD_DCtx *)output_local);
            return ((long)(int)(uint)(ZVar6 == ZSTDnit_block) * 3 + sVar11) -
                   (long)output_local[0x4ec].dst;
          }
          if (output_local[0x4ed].pos == output_local[0x4ed].size) {
            if (*(int *)&output_local[0x4ef].dst != 0) {
              if (*(ulong *)(src + 8) <= *(ulong *)(src + 0x10)) {
                *(undefined4 *)((long)&output_local[0x4eb].dst + 4) = 2;
                return 1;
              }
              *(long *)(src + 0x10) = *(long *)(src + 0x10) + 1;
            }
            return 0;
          }
          if (*(int *)&output_local[0x4ef].dst == 0) {
            *(long *)(src + 0x10) = *(long *)(src + 0x10) + -1;
            *(undefined4 *)&output_local[0x4ef].dst = 1;
          }
          return 1;
        }
        switch(*(undefined4 *)((long)&output_local[0x4eb].dst + 4)) {
        case 0:
          *(undefined4 *)((long)&output_local[0x4eb].dst + 4) = 1;
          output_local[0x4ed].pos = 0;
          output_local[0x4ed].size = 0;
          output_local[0x4ec].dst = (void *)0x0;
          output_local[0x4ee].dst = (void *)0x0;
          *(undefined4 *)((long)&output_local[0x4ee].pos + 4) = 0;
          *(undefined4 *)&output_local[0x4ef].dst = 0;
          output_local[0x4ef].pos = (size_t)input_local->src;
          output_local[0x4f0].dst = (void *)input_local->size;
          output_local[0x4f0].size = input_local->pos;
        case 1:
          local_150 = (void *)ZSTD_getFrameHeader_advanced
                                        ((ZSTD_frameHeader *)(output_local + 0x4df),
                                         &output_local[0x1a47].size,(size_t)output_local[0x4ee].dst,
                                         *(ZSTD_format_e *)&output_local[0x4e6].dst);
          if ((*(int *)&output_local[0x4eb].dst != 0) && (output_local[0x4ea].pos != 0)) {
            ZSTD_DCtx_selectFrameDDict((ZSTD_DCtx *)output_local);
          }
          uVar3 = ERR_isError((size_t)local_150);
          if (uVar3 != 0) {
            return (size_t)local_150;
          }
          if (local_150 == (void *)0x0) {
            if ((((output_local[0x4df].dst == (void *)0xffffffffffffffff) ||
                 (*(int *)((long)&output_local[0x4df].pos + 4) == 1)) ||
                (op + -(long)pcStack_68 < output_local[0x4df].dst)) ||
               (sVar11 = ZSTD_findFrameCompressedSize(iend,(long)ip - (long)iend),
               pZVar2 = output_local, src_00 = iend, dst_00 = pcStack_68,
               (ulong)((long)ip - (long)iend) < sVar11)) {
              pZVar2 = output_local;
              if ((((int)output_local[0x4ef].size == 1) &&
                  (*(int *)((long)&output_local[0x4df].pos + 4) != 1)) &&
                 ((output_local[0x4df].dst != (void *)0xffffffffffffffff &&
                  (op + -(long)pcStack_68 < output_local[0x4df].dst)))) {
                return 0xffffffffffffffba;
              }
              pZVar7 = ZSTD_getDDict((ZSTD_DCtx *)output_local);
              sVar11 = ZSTD_decompressBegin_usingDDict((ZSTD_DCtx *)pZVar2,pZVar7);
              uVar3 = ERR_isError(sVar11);
              if (uVar3 != 0) {
                return sVar11;
              }
              UVar4 = MEM_readLE32(&output_local[0x1a47].size);
              if ((UVar4 & 0xfffffff0) == 0x184d2a50) {
                UVar4 = MEM_readLE32((void *)((long)&output_local[0x1a47].size + 4));
                output_local[0x4de].pos = (ulong)UVar4;
                *(undefined4 *)((long)&output_local[0x4e1].size + 4) = 7;
              }
              else {
                sVar11 = ZSTD_decodeFrameHeader
                                   ((ZSTD_DCtx *)output_local,&output_local[0x1a47].size,
                                    (size_t)output_local[0x4ee].dst);
                uVar3 = ERR_isError(sVar11);
                if (uVar3 != 0) {
                  return sVar11;
                }
                output_local[0x4de].pos = 3;
                *(undefined4 *)((long)&output_local[0x4e1].size + 4) = 2;
              }
              if (output_local[0x4df].size < 0x401) {
                local_188 = 0x400;
              }
              else {
                local_188 = output_local[0x4df].size;
              }
              output_local[0x4df].size = local_188;
              if (output_local[0x4ec].size < output_local[0x4df].size) {
                return 0xfffffffffffffff0;
              }
              if ((uint)output_local[0x4df].pos < 5) {
                local_18c = 4;
              }
              else {
                local_18c = (uint)output_local[0x4df].pos;
              }
              uVar9 = (ulong)local_18c;
              if ((int)output_local[0x4ef].size == 0) {
                local_198 = (void *)ZSTD_decodingBufferSize_min
                                              (output_local[0x4df].size,
                                               (unsigned_long_long)output_local[0x4df].dst);
              }
              else {
                local_198 = (void *)0x0;
              }
              ZSTD_DCtx_updateOversizedDuration
                        ((ZSTD_DStream *)output_local,uVar9,(size_t)local_198);
              bVar12 = true;
              if (uVar9 <= output_local[0x4eb].pos) {
                bVar12 = output_local[0x4ed].dst < local_198;
              }
              iVar5 = ZSTD_DCtx_isOversizedTooLong((ZSTD_DStream *)output_local);
              if ((bVar12) || (iVar5 != 0)) {
                if (output_local[0x4e8].pos == 0) {
                  ZSTD_customFree((void *)output_local[0x4eb].size,
                                  *(ZSTD_customMem *)(output_local + 0x4e7));
                  output_local[0x4eb].pos = 0;
                  output_local[0x4ed].dst = (void *)0x0;
                  pvVar8 = ZSTD_customMalloc(uVar9 + (long)local_198,
                                             *(ZSTD_customMem *)(output_local + 0x4e7));
                  output_local[0x4eb].size = (size_t)pvVar8;
                  if (output_local[0x4eb].size == 0) {
                    return 0xffffffffffffffc0;
                  }
                }
                else if (output_local[0x4e8].pos - 0x276d8 < uVar9 + (long)local_198) {
                  return 0xffffffffffffffc0;
                }
                output_local[0x4eb].pos = uVar9;
                output_local[0x4ec].pos = output_local[0x4eb].size + output_local[0x4eb].pos;
                output_local[0x4ed].dst = local_198;
              }
              *(undefined4 *)((long)&output_local[0x4eb].dst + 4) = 2;
switchD_00d3d076_caseD_2:
              sVar11 = ZSTD_nextSrcSizeToDecompressWithInputSize
                                 ((ZSTD_DCtx *)output_local,(long)ip - (long)dst);
              if (sVar11 == 0) {
                *(undefined4 *)((long)&output_local[0x4eb].dst + 4) = 0;
                bVar1 = false;
              }
              else if ((ulong)((long)ip - (long)dst) < sVar11) {
                if (dst == ip) {
                  bVar1 = false;
                }
                else {
                  *(undefined4 *)((long)&output_local[0x4eb].dst + 4) = 3;
switchD_00d3d076_caseD_3:
                  sVar11 = ZSTD_nextSrcSizeToDecompress((ZSTD_DCtx *)output_local);
                  uVar9 = sVar11 - (long)output_local[0x4ec].dst;
                  iVar5 = ZSTD_isSkipFrame((ZSTD_DCtx *)output_local);
                  if (iVar5 == 0) {
                    if (output_local[0x4eb].pos - (long)output_local[0x4ec].dst < uVar9) {
                      return 0xffffffffffffffec;
                    }
                    err_code_4 = ZSTD_limitCopy((void *)(output_local[0x4eb].size +
                                                        (long)output_local[0x4ec].dst),uVar9,dst,
                                                (long)ip - (long)dst);
                  }
                  else {
                    local_1a8 = uVar9;
                    if ((ulong)((long)ip - (long)dst) <= uVar9) {
                      local_1a8 = (long)ip - (long)dst;
                    }
                    err_code_4 = local_1a8;
                  }
                  dst = dst + err_code_4;
                  output_local[0x4ec].dst = (void *)(err_code_4 + (long)output_local[0x4ec].dst);
                  if (err_code_4 < uVar9) {
                    bVar1 = false;
                  }
                  else {
                    output_local[0x4ec].dst = (void *)0x0;
                    sVar11 = ZSTD_decompressContinueStream
                                       ((ZSTD_DStream *)output_local,&stack0xffffffffffffff98,op,
                                        (void *)output_local[0x4eb].size,sVar11);
                    uVar3 = ERR_isError(sVar11);
                    if (uVar3 != 0) {
                      return sVar11;
                    }
                  }
                }
              }
              else {
                sVar10 = ZSTD_decompressContinueStream
                                   ((ZSTD_DStream *)output_local,&stack0xffffffffffffff98,op,dst,
                                    sVar11);
                uVar3 = ERR_isError(sVar10);
                if (uVar3 != 0) {
                  return sVar10;
                }
                dst = dst + sVar11;
              }
            }
            else {
              sVar10 = (long)op - (long)pcStack_68;
              pZVar7 = ZSTD_getDDict((ZSTD_DCtx *)output_local);
              sVar10 = ZSTD_decompress_usingDDict
                                 ((ZSTD_DCtx *)pZVar2,dst_00,sVar10,src_00,sVar11,pZVar7);
              uVar3 = ERR_isError(sVar10);
              if (uVar3 != 0) {
                return sVar10;
              }
              dst = iend + sVar11;
              pcStack_68 = pcStack_68 + sVar10;
              output_local[0x4de].pos = 0;
              *(undefined4 *)((long)&output_local[0x4eb].dst + 4) = 0;
              bVar1 = false;
            }
          }
          else {
            uVar9 = (long)local_150 - (long)output_local[0x4ee].dst;
            __n = (long)ip - (long)dst;
            if (__n < uVar9) {
              if (__n != 0) {
                memcpy((void *)((long)&output_local[0x1a47].size + (long)output_local[0x4ee].dst),
                       dst,__n);
                output_local[0x4ee].dst = (void *)(__n + (long)output_local[0x4ee].dst);
              }
              *(undefined8 *)(src + 0x10) = *(undefined8 *)(src + 8);
              iVar5 = 2;
              if (*(int *)&output_local[0x4e6].dst == 0) {
                iVar5 = 6;
              }
              if (local_150 < (void *)(long)iVar5) {
                iVar5 = 2;
                if (*(int *)&output_local[0x4e6].dst == 0) {
                  iVar5 = 6;
                }
                local_150 = (void *)(long)iVar5;
              }
              return (long)local_150 + (3 - (long)output_local[0x4ee].dst);
            }
            memcpy((void *)((long)&output_local[0x1a47].size + (long)output_local[0x4ee].dst),dst,
                   uVar9);
            output_local[0x4ee].dst = local_150;
            dst = dst + uVar9;
          }
          break;
        case 2:
          goto switchD_00d3d076_caseD_2;
        case 3:
          goto switchD_00d3d076_caseD_3;
        case 4:
          sVar11 = output_local[0x4ed].pos - output_local[0x4ed].size;
          sVar10 = ZSTD_limitCopy(pcStack_68,(long)op - (long)pcStack_68,
                                  (void *)(output_local[0x4ec].pos + output_local[0x4ed].size),
                                  sVar11);
          pcStack_68 = pcStack_68 + sVar10;
          output_local[0x4ed].size = sVar10 + output_local[0x4ed].size;
          if (sVar10 == sVar11) {
            *(undefined4 *)((long)&output_local[0x4eb].dst + 4) = 2;
            if ((output_local[0x4ed].dst < output_local[0x4df].dst) &&
               (output_local[0x4ed].dst <
                (void *)(output_local[0x4ed].size + (ulong)(uint)output_local[0x4df].pos))) {
              output_local[0x4ed].pos = 0;
              output_local[0x4ed].size = 0;
            }
          }
          else {
            bVar1 = false;
          }
          break;
        default:
          return 0xffffffffffffffff;
        }
      } while( true );
    }
  }
  return (size_t)zds_local;
}

Assistant:

size_t ZSTD_decompressStream(ZSTD_DStream* zds, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    const char* const src = (const char*)input->src;
    const char* const istart = input->pos != 0 ? src + input->pos : src;
    const char* const iend = input->size != 0 ? src + input->size : src;
    const char* ip = istart;
    char* const dst = (char*)output->dst;
    char* const ostart = output->pos != 0 ? dst + output->pos : dst;
    char* const oend = output->size != 0 ? dst + output->size : dst;
    char* op = ostart;
    U32 someMoreWork = 1;

    DEBUGLOG(5, "ZSTD_decompressStream");
    RETURN_ERROR_IF(
        input->pos > input->size,
        srcSize_wrong,
        "forbidden. in: pos: %u   vs size: %u",
        (U32)input->pos, (U32)input->size);
    RETURN_ERROR_IF(
        output->pos > output->size,
        dstSize_tooSmall,
        "forbidden. out: pos: %u   vs size: %u",
        (U32)output->pos, (U32)output->size);
    DEBUGLOG(5, "input size : %u", (U32)(input->size - input->pos));
    FORWARD_IF_ERROR(ZSTD_checkOutBuffer(zds, output), "");

    while (someMoreWork) {
        switch(zds->streamStage)
        {
        case zdss_init :
            DEBUGLOG(5, "stage zdss_init => transparent reset ");
            zds->streamStage = zdss_loadHeader;
            zds->lhSize = zds->inPos = zds->outStart = zds->outEnd = 0;
            zds->legacyVersion = 0;
            zds->hostageByte = 0;
            zds->expectedOutBuffer = *output;
            /* fall-through */

        case zdss_loadHeader :
            DEBUGLOG(5, "stage zdss_loadHeader (srcSize : %u)", (U32)(iend - ip));
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            if (zds->legacyVersion) {
                RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                    "legacy support is incompatible with static dctx");
                {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, zds->legacyVersion, output, input);
                    if (hint==0) zds->streamStage = zdss_init;
                    return hint;
            }   }
#endif
            {   size_t const hSize = ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format);
                if (zds->refMultipleDDicts && zds->ddictSet) {
                    ZSTD_DCtx_selectFrameDDict(zds);
                }
                DEBUGLOG(5, "header size : %u", (U32)hSize);
                if (ZSTD_isError(hSize)) {
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
                    U32 const legacyVersion = ZSTD_isLegacy(istart, iend-istart);
                    if (legacyVersion) {
                        ZSTD_DDict const* const ddict = ZSTD_getDDict(zds);
                        const void* const dict = ddict ? ZSTD_DDict_dictContent(ddict) : NULL;
                        size_t const dictSize = ddict ? ZSTD_DDict_dictSize(ddict) : 0;
                        DEBUGLOG(5, "ZSTD_decompressStream: detected legacy version v0.%u", legacyVersion);
                        RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                            "legacy support is incompatible with static dctx");
                        FORWARD_IF_ERROR(ZSTD_initLegacyStream(&zds->legacyContext,
                                    zds->previousLegacyVersion, legacyVersion,
                                    dict, dictSize), "");
                        zds->legacyVersion = zds->previousLegacyVersion = legacyVersion;
                        {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, legacyVersion, output, input);
                            if (hint==0) zds->streamStage = zdss_init;   /* or stay in stage zdss_loadHeader */
                            return hint;
                    }   }
#endif
                    return hSize;   /* error */
                }
                if (hSize != 0) {   /* need more input */
                    size_t const toLoad = hSize - zds->lhSize;   /* if hSize!=0, hSize > zds->lhSize */
                    size_t const remainingInput = (size_t)(iend-ip);
                    assert(iend >= ip);
                    if (toLoad > remainingInput) {   /* not enough input to load full header */
                        if (remainingInput > 0) {
                            ZSTD_memcpy(zds->headerBuffer + zds->lhSize, ip, remainingInput);
                            zds->lhSize += remainingInput;
                        }
                        input->pos = input->size;
                        return (MAX((size_t)ZSTD_FRAMEHEADERSIZE_MIN(zds->format), hSize) - zds->lhSize) + ZSTD_blockHeaderSize;   /* remaining header bytes + next block header */
                    }
                    assert(ip != NULL);
                    ZSTD_memcpy(zds->headerBuffer + zds->lhSize, ip, toLoad); zds->lhSize = hSize; ip += toLoad;
                    break;
            }   }

            /* check for single-pass mode opportunity */
            if (zds->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                && zds->fParams.frameType != ZSTD_skippableFrame
                && (U64)(size_t)(oend-op) >= zds->fParams.frameContentSize) {
                size_t const cSize = ZSTD_findFrameCompressedSize(istart, (size_t)(iend-istart));
                if (cSize <= (size_t)(iend-istart)) {
                    /* shortcut : using single-pass mode */
                    size_t const decompressedSize = ZSTD_decompress_usingDDict(zds, op, (size_t)(oend-op), istart, cSize, ZSTD_getDDict(zds));
                    if (ZSTD_isError(decompressedSize)) return decompressedSize;
                    DEBUGLOG(4, "shortcut to single-pass ZSTD_decompress_usingDDict()")
                    ip = istart + cSize;
                    op += decompressedSize;
                    zds->expected = 0;
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
            }   }

            /* Check output buffer is large enough for ZSTD_odm_stable. */
            if (zds->outBufferMode == ZSTD_bm_stable
                && zds->fParams.frameType != ZSTD_skippableFrame
                && zds->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                && (U64)(size_t)(oend-op) < zds->fParams.frameContentSize) {
                RETURN_ERROR(dstSize_tooSmall, "ZSTD_obm_stable passed but ZSTD_outBuffer is too small");
            }

            /* Consume header (see ZSTDds_decodeFrameHeader) */
            DEBUGLOG(4, "Consume header");
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(zds, ZSTD_getDDict(zds)), "");

            if ((MEM_readLE32(zds->headerBuffer) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {  /* skippable frame */
                zds->expected = MEM_readLE32(zds->headerBuffer + ZSTD_FRAMEIDSIZE);
                zds->stage = ZSTDds_skipFrame;
            } else {
                FORWARD_IF_ERROR(ZSTD_decodeFrameHeader(zds, zds->headerBuffer, zds->lhSize), "");
                zds->expected = ZSTD_blockHeaderSize;
                zds->stage = ZSTDds_decodeBlockHeader;
            }

            /* control buffer memory usage */
            DEBUGLOG(4, "Control max memory usage (%u KB <= max %u KB)",
                        (U32)(zds->fParams.windowSize >>10),
                        (U32)(zds->maxWindowSize >> 10) );
            zds->fParams.windowSize = MAX(zds->fParams.windowSize, 1U << ZSTD_WINDOWLOG_ABSOLUTEMIN);
            RETURN_ERROR_IF(zds->fParams.windowSize > zds->maxWindowSize,
                            frameParameter_windowTooLarge, "");

            /* Adapt buffer sizes to frame header instructions */
            {   size_t const neededInBuffSize = MAX(zds->fParams.blockSizeMax, 4 /* frame checksum */);
                size_t const neededOutBuffSize = zds->outBufferMode == ZSTD_bm_buffered
                        ? ZSTD_decodingBufferSize_min(zds->fParams.windowSize, zds->fParams.frameContentSize)
                        : 0;

                ZSTD_DCtx_updateOversizedDuration(zds, neededInBuffSize, neededOutBuffSize);

                {   int const tooSmall = (zds->inBuffSize < neededInBuffSize) || (zds->outBuffSize < neededOutBuffSize);
                    int const tooLarge = ZSTD_DCtx_isOversizedTooLong(zds);

                    if (tooSmall || tooLarge) {
                        size_t const bufferSize = neededInBuffSize + neededOutBuffSize;
                        DEBUGLOG(4, "inBuff  : from %u to %u",
                                    (U32)zds->inBuffSize, (U32)neededInBuffSize);
                        DEBUGLOG(4, "outBuff : from %u to %u",
                                    (U32)zds->outBuffSize, (U32)neededOutBuffSize);
                        if (zds->staticSize) {  /* static DCtx */
                            DEBUGLOG(4, "staticSize : %u", (U32)zds->staticSize);
                            assert(zds->staticSize >= sizeof(ZSTD_DCtx));  /* controlled at init */
                            RETURN_ERROR_IF(
                                bufferSize > zds->staticSize - sizeof(ZSTD_DCtx),
                                memory_allocation, "");
                        } else {
                            ZSTD_customFree(zds->inBuff, zds->customMem);
                            zds->inBuffSize = 0;
                            zds->outBuffSize = 0;
                            zds->inBuff = (char*)ZSTD_customMalloc(bufferSize, zds->customMem);
                            RETURN_ERROR_IF(zds->inBuff == NULL, memory_allocation, "");
                        }
                        zds->inBuffSize = neededInBuffSize;
                        zds->outBuff = zds->inBuff + zds->inBuffSize;
                        zds->outBuffSize = neededOutBuffSize;
            }   }   }
            zds->streamStage = zdss_read;
            /* fall-through */

        case zdss_read:
            DEBUGLOG(5, "stage zdss_read");
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompressWithInputSize(zds, (size_t)(iend - ip));
                DEBUGLOG(5, "neededInSize = %u", (U32)neededInSize);
                if (neededInSize==0) {  /* end of frame */
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
                }
                if ((size_t)(iend-ip) >= neededInSize) {  /* decode directly from src */
                    FORWARD_IF_ERROR(ZSTD_decompressContinueStream(zds, &op, oend, ip, neededInSize), "");
                    ip += neededInSize;
                    /* Function modifies the stage so we must break */
                    break;
            }   }
            if (ip==iend) { someMoreWork = 0; break; }   /* no more input */
            zds->streamStage = zdss_load;
            /* fall-through */

        case zdss_load:
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                size_t const toLoad = neededInSize - zds->inPos;
                int const isSkipFrame = ZSTD_isSkipFrame(zds);
                size_t loadedSize;
                /* At this point we shouldn't be decompressing a block that we can stream. */
                assert(neededInSize == ZSTD_nextSrcSizeToDecompressWithInputSize(zds, iend - ip));
                if (isSkipFrame) {
                    loadedSize = MIN(toLoad, (size_t)(iend-ip));
                } else {
                    RETURN_ERROR_IF(toLoad > zds->inBuffSize - zds->inPos,
                                    corruption_detected,
                                    "should never happen");
                    loadedSize = ZSTD_limitCopy(zds->inBuff + zds->inPos, toLoad, ip, (size_t)(iend-ip));
                }
                ip += loadedSize;
                zds->inPos += loadedSize;
                if (loadedSize < toLoad) { someMoreWork = 0; break; }   /* not enough input, wait for more */

                /* decode loaded input */
                zds->inPos = 0;   /* input is consumed */
                FORWARD_IF_ERROR(ZSTD_decompressContinueStream(zds, &op, oend, zds->inBuff, neededInSize), "");
                /* Function modifies the stage so we must break */
                break;
            }
        case zdss_flush:
            {   size_t const toFlushSize = zds->outEnd - zds->outStart;
                size_t const flushedSize = ZSTD_limitCopy(op, (size_t)(oend-op), zds->outBuff + zds->outStart, toFlushSize);
                op += flushedSize;
                zds->outStart += flushedSize;
                if (flushedSize == toFlushSize) {  /* flush completed */
                    zds->streamStage = zdss_read;
                    if ( (zds->outBuffSize < zds->fParams.frameContentSize)
                      && (zds->outStart + zds->fParams.blockSizeMax > zds->outBuffSize) ) {
                        DEBUGLOG(5, "restart filling outBuff from beginning (left:%i, needed:%u)",
                                (int)(zds->outBuffSize - zds->outStart),
                                (U32)zds->fParams.blockSizeMax);
                        zds->outStart = zds->outEnd = 0;
                    }
                    break;
            }   }
            /* cannot complete flush */
            someMoreWork = 0;
            break;

        default:
            assert(0);    /* impossible */
            RETURN_ERROR(GENERIC, "impossible to reach");   /* some compiler require default to do something */
    }   }

    /* result */
    input->pos = (size_t)(ip - (const char*)(input->src));
    output->pos = (size_t)(op - (char*)(output->dst));

    /* Update the expected output buffer for ZSTD_obm_stable. */
    zds->expectedOutBuffer = *output;

    if ((ip==istart) && (op==ostart)) {  /* no forward progress */
        zds->noForwardProgress ++;
        if (zds->noForwardProgress >= ZSTD_NO_FORWARD_PROGRESS_MAX) {
            RETURN_ERROR_IF(op==oend, dstSize_tooSmall, "");
            RETURN_ERROR_IF(ip==iend, srcSize_wrong, "");
            assert(0);
        }
    } else {
        zds->noForwardProgress = 0;
    }
    {   size_t nextSrcSizeHint = ZSTD_nextSrcSizeToDecompress(zds);
        if (!nextSrcSizeHint) {   /* frame fully decoded */
            if (zds->outEnd == zds->outStart) {  /* output fully flushed */
                if (zds->hostageByte) {
                    if (input->pos >= input->size) {
                        /* can't release hostage (not present) */
                        zds->streamStage = zdss_read;
                        return 1;
                    }
                    input->pos++;  /* release hostage */
                }   /* zds->hostageByte */
                return 0;
            }  /* zds->outEnd == zds->outStart */
            if (!zds->hostageByte) { /* output not fully flushed; keep last byte as hostage; will be released when all output is flushed */
                input->pos--;   /* note : pos > 0, otherwise, impossible to finish reading last block */
                zds->hostageByte=1;
            }
            return 1;
        }  /* nextSrcSizeHint==0 */
        nextSrcSizeHint += ZSTD_blockHeaderSize * (ZSTD_nextInputType(zds) == ZSTDnit_block);   /* preload header of next block */
        assert(zds->inPos <= nextSrcSizeHint);
        nextSrcSizeHint -= zds->inPos;   /* part already loaded*/
        return nextSrcSizeHint;
    }
}